

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxx.cpp
# Opt level: O1

bool mg::data::nxgx_decompress(Nxx *header,uint8_t *data,string *out)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  uint8_t *puStack_98;
  z_stream istream;
  
  bVar4 = false;
  std::__cxx11::string::resize((ulong)out,(char)header->size);
  istream.data_type = 0;
  istream._92_4_ = 0;
  istream.adler = 0;
  istream.zfree = (free_func)0x0;
  istream.opaque = (voidpf)0x0;
  istream.state = (internal_state *)0x0;
  istream.zalloc = (alloc_func)0x0;
  istream.total_out = 0;
  istream.msg = (char *)0x0;
  istream.avail_in = 0;
  istream._12_4_ = 0;
  istream.next_in = (Bytef *)(ulong)header->compressed_size;
  istream.next_out = (Bytef *)(ulong)header->size;
  istream.total_in = (uLong)(out->_M_dataplus)._M_p;
  istream.avail_out = 0;
  istream._36_4_ = 0;
  puStack_98 = data;
  iVar1 = inflateInit2_(&puStack_98,0x1f,"1.2.11",0x70);
  uVar3 = 1;
  if (iVar1 == 0) {
    uVar2 = inflate(&puStack_98,2);
    if (uVar2 < 2) {
      iVar1 = inflateEnd(&puStack_98);
      bVar4 = iVar1 == 0;
      if (bVar4) {
        return bVar4;
      }
    }
    else {
      bVar4 = false;
      uVar3 = (ulong)uVar2;
    }
  }
  fprintf(_stderr,"zlib error: %d: %s\n",uVar3,istream.total_out);
  return bVar4;
}

Assistant:

bool nxgx_decompress(const Nxx &header, const uint8_t *data, std::string &out) {
  // Expand output to hold data
  out.resize(header.size);

  // Create inflate stream
  z_stream istream{};
  istream.avail_in = header.compressed_size;
  istream.next_in = const_cast<uint8_t *>(data);
  istream.avail_out = header.size;
  istream.next_out = reinterpret_cast<uint8_t *>(out.data());
  istream.total_out = 0;

  // Init inflate context
  if (int err = inflateInit2(&istream, 16 + MAX_WBITS) != Z_OK) {
    fprintf(stderr, "zlib error: %d: %s\n", err, istream.msg);
    return false;
  }

  // Perform inflation
  const int err = inflate(&istream, Z_SYNC_FLUSH);
  if (err != Z_OK && err != Z_STREAM_END) {
    fprintf(stderr, "zlib error: %d: %s\n", err, istream.msg);
    return false;
  }

  if (int err = inflateEnd(&istream) != Z_OK) {
    fprintf(stderr, "zlib error: %d: %s\n", err, istream.msg);
    return false;
  }

  return true;
}